

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Iterating_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Iterating_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  long in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  int i;
  iterator it;
  undefined4 in_stack_fffffffffffffc38;
  uint in_stack_fffffffffffffc3c;
  char *in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc5c;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc60;
  Type in_stack_fffffffffffffc6c;
  AssertHelper *in_stack_fffffffffffffc70;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  char *in_stack_fffffffffffffca8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffcb0;
  AssertionResult *in_stack_fffffffffffffcb8;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffcc0;
  iterator local_308;
  dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_2e8;
  undefined1 local_2c9;
  AssertionResult local_2c8;
  int local_2b4;
  dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_2b0 [3];
  value_type local_268;
  pair<int,_int> local_254;
  int local_24c;
  value_type local_220;
  pair<int,_int> local_210;
  int local_208;
  value_type local_1d8;
  pair<int,_int> local_1c8;
  int local_1c0;
  value_type local_190;
  pair<int,_int> local_180;
  int local_178;
  value_type local_148;
  pair<int,_int> local_138;
  int local_130;
  value_type local_100;
  pair<int,_int> local_f0;
  int local_e8;
  value_type local_b8;
  pair<int,_int> local_a8;
  int local_a0;
  value_type local_70;
  pair<int,_int> local_60;
  int local_58;
  value_type local_28;
  pair<int,_int> local_18;
  int local_10;
  
  this_00 = (dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(in_RDI + 0x10);
  local_28 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  local_10 = local_28.second;
  local_18 = local_28.first;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
  local_70 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  local_58 = local_70.second;
  local_60 = local_70.first;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
  local_b8 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  local_a0 = local_b8.second;
  local_a8 = local_b8.first;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
  local_100 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  local_e8 = local_100.second;
  local_f0 = local_100.first;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
  local_148 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  local_130 = local_148.second;
  local_138 = local_148.first;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
  local_190 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  local_178 = local_190.second;
  local_180 = local_190.first;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
  local_1d8 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  local_1c0 = local_1d8.second;
  local_1c8 = local_1d8.first;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
  local_220 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  local_208 = local_220.second;
  local_210 = local_220.first;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
  local_268 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  local_254 = local_268.first;
  local_24c = local_268.second;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffc80);
  for (local_2b4 = 1; local_2b4 < 10; local_2b4 = local_2b4 + 1) {
    in_stack_fffffffffffffc3c = in_stack_fffffffffffffc3c & 0xffffff;
    if (local_2b4 != 0) {
      google::
      dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::operator++(this_00,in_stack_fffffffffffffc3c);
      google::
      BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::end(in_stack_fffffffffffffc80);
      bVar1 = google::
              dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_2e8,&local_308);
      in_stack_fffffffffffffc3c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc3c);
    }
    local_2c9 = (undefined1)(in_stack_fffffffffffffc3c >> 0x18);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)this_00,
               (bool *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               (type *)0xb10a44);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0._M_head_impl,
                 in_stack_fffffffffffffca8,
                 (char *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                 (char *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                 in_stack_fffffffffffffc50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffcc0,(Message *)in_stack_fffffffffffffcb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffcb8);
      testing::Message::~Message((Message *)0xb10b05);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xb10b99);
  }
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffc80);
  uVar2 = google::
          dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(local_2b0,(iterator *)&stack0xfffffffffffffc80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,
             (bool *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),(type *)0xb10bff)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffca8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0._M_head_impl,
               in_stack_fffffffffffffca8,(char *)CONCAT17(uVar2,in_stack_fffffffffffffca0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,(char *)in_stack_fffffffffffffc60
               ,in_stack_fffffffffffffc5c,in_stack_fffffffffffffc50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffcc0,(Message *)in_stack_fffffffffffffcb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc50);
    testing::Message::~Message((Message *)0xb10c9f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb10d21);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Iterating) {
  // Test a bit more iterating than just one ++.
  this->ht_.insert(this->UniqueObject(1));
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  typename TypeParam::iterator it = this->ht_.begin();
  for (int i = 1; i <= 9; i++) {  // start at 1 so i is never 0
    // && here makes it easier to tell what loop iteration the test failed on.
    EXPECT_TRUE(i && (it++ != this->ht_.end()));
  }
  EXPECT_TRUE(it == this->ht_.end());
}